

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_logger.c
# Opt level: O0

void pcp_logger(pcp_loglvl_e log_level,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list ap;
  char *np;
  char *p;
  int size;
  int n;
  char *fmt_local;
  pcp_loglvl_e log_level_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  p._0_4_ = 0x100;
  if ((log_level <= pcp_log_level) &&
     (local_e8 = in_RDX, local_e0 = in_RCX, local_d8 = in_R8, local_d0 = in_R9,
     pcVar2 = (char *)malloc(0x100), pcVar2 != (char *)0x0)) {
    do {
      np = pcVar2;
      ap[0].overflow_arg_area = local_f8;
      ap[0]._0_8_ = &stack0x00000008;
      local_44 = 0x30;
      local_48 = 0x10;
      iVar1 = vsnprintf(np,(long)(int)p,fmt,&local_48);
      if ((-1 < iVar1) && (iVar1 < (int)p)) {
        if (logger != (external_logger)0x0) {
          (*logger)(log_level,np);
        }
        free(np);
        return;
      }
      if (iVar1 < 0) {
        p._0_4_ = (int)p << 1;
      }
      else {
        p._0_4_ = iVar1 + 1;
      }
      ap[0].reg_save_area = realloc(np,(long)(int)p);
      pcVar2 = (char *)ap[0].reg_save_area;
    } while ((char *)ap[0].reg_save_area != (char *)0x0);
    free(np);
  }
  return;
}

Assistant:

void pcp_logger(pcp_loglvl_e log_level, const char *fmt, ...) {
    int n;
    int size = 256; /* Guess we need no more than 256 bytes. */
    char *p, *np;
    va_list ap;

    if (log_level > pcp_log_level) {
        return;
    }

    if (!(p = (char *)malloc(size))) {
        return; // LCOV_EXCL_LINE
    }

    while (1) {

        /* Try to print in the allocated space. */

        va_start(ap, fmt);
        n = vsnprintf(p, size, fmt, ap);
        va_end(ap);

        /* If that worked, return the string. */

        if (n > -1 && n < size) {
            break;
        }

        /* Else try again with more space. */

        if (n > -1)       /* glibc 2.1 */
            size = n + 1; /* precisely what is needed */
        else
            /* glibc 2.0 */
            size *= 2; /* twice the old size */ // LCOV_EXCL_LINE

        if (!(np = (char *)realloc(p, size))) {
            free(p); // LCOV_EXCL_LINE
            return;  // LCOV_EXCL_LINE
        }
        p = np;
    }

    if (logger)
        (*logger)(log_level, p);

    free(p);
    return;
}